

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld,int *aChange,
                     int bChngRowid)

{
  u8 uVar1;
  sqlite3 *psVar2;
  char *z;
  undefined1 uVar3;
  int iVar4;
  uint uVar5;
  FKey *p;
  sColMap *psVar6;
  Expr *pEVar7;
  Expr *pEVar8;
  Expr *pRight;
  ExprList *pEList;
  SrcList *pSrc;
  Select *pDup;
  Trigger *p_00;
  Schema *pSVar9;
  Select *pSVar10;
  i16 *piVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  TriggerStep *pTVar15;
  bool bVar16;
  Expr *local_f0;
  Expr *local_e8;
  ExprList *local_d8;
  int *aiCol;
  int local_b4;
  int *local_b0;
  sqlite3 *local_a8;
  Index *pIdx;
  Token tOld;
  Token tFromCol;
  Token tNew;
  Token tToCol;
  
  if ((pParse->db->flags & 0x4000) != 0) {
    local_b4 = regOld;
    p = sqlite3FkReferences(pTab);
    bVar16 = pChanges != (ExprList *)0x0;
    local_b0 = aChange;
    for (; p != (FKey *)0x0; p = p->pNextTo) {
      if ((aChange == (int *)0x0) ||
         (iVar4 = fkParentIsModified(pTab,p,aChange,bChngRowid), iVar4 != 0)) {
        psVar2 = pParse->db;
        uVar1 = p->aAction[bVar16];
        if ((uVar1 != '\a') || ((psVar2->flags & 0x80000) == 0)) {
          p_00 = p->apTrigger[bVar16];
          local_a8 = psVar2;
          if ((uVar1 == '\0') || (p_00 != (Trigger *)0x0)) {
            if (p_00 != (Trigger *)0x0) {
LAB_0017f2b2:
              sqlite3CodeRowTriggerDirect(pParse,p_00,pTab,local_b4,2,0);
            }
          }
          else {
            pIdx = (Index *)0x0;
            aiCol = (int *)0x0;
            iVar4 = sqlite3FkLocateIndex(pParse,pTab,p,&pIdx,&aiCol);
            psVar2 = local_a8;
            if (iVar4 == 0) {
              lVar14 = 0;
              lVar13 = 0;
              local_f0 = (Expr *)0x0;
              local_d8 = (ExprList *)0x0;
              local_e8 = (Expr *)0x0;
              for (lVar12 = 0; lVar12 < p->nCol; lVar12 = lVar12 + 1) {
                tOld.z = "old";
                tOld.n = 3;
                tOld._12_4_ = 0;
                psVar6 = (sColMap *)((long)aiCol + lVar14);
                if (aiCol == (int *)0x0) {
                  psVar6 = p->aCol;
                }
                tNew.z = "new";
                tNew.n = 3;
                tNew._12_4_ = 0;
                piVar11 = &pTab->iPKey;
                if (pIdx != (Index *)0x0) {
                  piVar11 = (i16 *)((long)pIdx->aiColumn + lVar13);
                }
                iVar4 = psVar6->iFrom;
                tToCol.z = pTab->aCol[*piVar11].zName;
                tToCol.n = sqlite3Strlen30(tToCol.z);
                tFromCol.z = p->pFrom->aCol[iVar4].zName;
                tFromCol.n = sqlite3Strlen30(tFromCol.z);
                pEVar7 = sqlite3ExprAlloc(psVar2,0x3b,&tOld,0);
                pEVar8 = sqlite3ExprAlloc(psVar2,0x3b,&tToCol,0);
                pEVar7 = sqlite3PExpr(pParse,0x86,pEVar7,pEVar8);
                pEVar8 = sqlite3ExprAlloc(psVar2,0x3b,&tFromCol,0);
                pEVar7 = sqlite3PExpr(pParse,0x35,pEVar7,pEVar8);
                local_f0 = sqlite3ExprAnd(psVar2,local_f0,pEVar7);
                if (pChanges != (ExprList *)0x0) {
                  pEVar7 = sqlite3ExprAlloc(psVar2,0x3b,&tOld,0);
                  pEVar8 = sqlite3ExprAlloc(psVar2,0x3b,&tToCol,0);
                  pEVar7 = sqlite3PExpr(pParse,0x86,pEVar7,pEVar8);
                  pEVar8 = sqlite3ExprAlloc(psVar2,0x3b,&tNew,0);
                  pRight = sqlite3ExprAlloc(psVar2,0x3b,&tToCol,0);
                  pEVar8 = sqlite3PExpr(pParse,0x86,pEVar8,pRight);
                  pEVar7 = sqlite3PExpr(pParse,0x2d,pEVar7,pEVar8);
                  local_e8 = sqlite3ExprAnd(psVar2,local_e8,pEVar7);
                }
                if ((uVar1 != '\n' || pChanges != (ExprList *)0x0) && uVar1 != '\a') {
                  if (uVar1 == '\t') {
                    pEVar7 = p->pFrom->aCol[iVar4].pDflt;
                    if (pEVar7 == (Expr *)0x0) goto LAB_0017f00e;
                    pEVar7 = sqlite3ExprDup(psVar2,pEVar7,0);
                  }
                  else if (uVar1 == '\n') {
                    pEVar7 = sqlite3ExprAlloc(psVar2,0x3b,&tNew,0);
                    pEVar8 = sqlite3ExprAlloc(psVar2,0x3b,&tToCol,0);
                    pEVar7 = sqlite3PExpr(pParse,0x86,pEVar7,pEVar8);
                  }
                  else {
LAB_0017f00e:
                    pEVar7 = sqlite3ExprAlloc(psVar2,0x72,(Token *)0x0,0);
                  }
                  local_d8 = sqlite3ExprListAppend(pParse,local_d8,pEVar7);
                  sqlite3ExprListSetName(pParse,local_d8,&tFromCol,0);
                }
                lVar13 = lVar13 + 2;
                lVar14 = lVar14 + 4;
              }
              sqlite3DbFree(psVar2,aiCol);
              z = p->pFrom->zName;
              uVar5 = sqlite3Strlen30(z);
              if (uVar1 == '\a') {
                tOld.n = uVar5;
                tOld.z = z;
                pEVar7 = sqlite3Expr(psVar2,0x47,"FOREIGN KEY constraint failed");
                aChange = local_b0;
                if (pEVar7 != (Expr *)0x0) {
                  pEVar7->affinity = '\x02';
                }
                pEList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar7);
                pSrc = sqlite3SrcListAppend(pParse,(SrcList *)0x0,&tOld,(Token *)0x0);
                pDup = sqlite3SelectNew(pParse,pEList,pSrc,local_f0,(ExprList *)0x0,(Expr *)0x0,
                                        (ExprList *)0x0,0,(Expr *)0x0);
                local_f0 = (Expr *)0x0;
              }
              else {
                pDup = (Select *)0x0;
                aChange = local_b0;
              }
              psVar2 = local_a8;
              (local_a8->lookaside).bDisable = (local_a8->lookaside).bDisable + 1;
              p_00 = (Trigger *)sqlite3DbMallocZero(local_a8,(ulong)uVar5 + 0xa1);
              if (p_00 == (Trigger *)0x0) {
                pTVar15 = (TriggerStep *)0x0;
              }
              else {
                pTVar15 = (TriggerStep *)(p_00 + 1);
                p_00->step_list = pTVar15;
                p_00[1].pWhen = (Expr *)&p_00[2].op;
                memcpy(&p_00[2].op,z,(ulong)uVar5);
                pEVar7 = sqlite3ExprDup(psVar2,local_f0,1);
                p_00[1].pColumns = (IdList *)pEVar7;
                pSVar9 = (Schema *)sqlite3ExprListDup(psVar2,local_d8,1);
                p_00[1].pSchema = pSVar9;
                pSVar10 = sqlite3SelectDup(psVar2,pDup,1);
                *(Select **)&p_00[1].op = pSVar10;
                if (local_e8 == (Expr *)0x0) {
                  local_e8 = (Expr *)0x0;
                }
                else {
                  local_e8 = sqlite3PExpr(pParse,0x13,local_e8,(Expr *)0x0);
                  pEVar7 = sqlite3ExprDup(psVar2,local_e8,1);
                  p_00->pWhen = pEVar7;
                }
              }
              (psVar2->lookaside).bDisable = (psVar2->lookaside).bDisable - 1;
              sqlite3ExprDelete(psVar2,local_f0);
              sqlite3ExprDelete(psVar2,local_e8);
              sqlite3ExprListDelete(psVar2,local_d8);
              sqlite3SelectDelete(psVar2,pDup);
              if (psVar2->mallocFailed != '\x01') {
                if (uVar1 == '\a') {
                  uVar3 = 0x83;
                }
                else if ((uVar1 == '\n') && (pChanges == (ExprList *)0x0)) {
                  uVar3 = 0x79;
                }
                else {
                  uVar3 = 0x7a;
                }
                pTVar15->op = uVar3;
                pTVar15->pTrig = p_00;
                pSVar9 = pTab->pSchema;
                p_00->pSchema = pSVar9;
                p_00->pTabSchema = pSVar9;
                p->apTrigger[bVar16] = p_00;
                p_00->op = bVar16 + 'y';
                goto LAB_0017f2b2;
              }
              fkTriggerDelete(psVar2,p_00);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld,                     /* Address of array containing old row */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  /* If foreign-key support is enabled, iterate through all FKs that 
  ** refer to table pTab. If there is an action associated with the FK 
  ** for this operation (either update or delete), invoke the associated 
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      if( aChange==0 || fkParentIsModified(pTab, pFKey, aChange, bChngRowid) ){
        Trigger *pAct = fkActionTrigger(pParse, pTab, pFKey, pChanges);
        if( pAct ){
          sqlite3CodeRowTriggerDirect(pParse, pAct, pTab, regOld, OE_Abort, 0);
        }
      }
    }
  }
}